

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_master_table_create_dictionary
                    (ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                    ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size,
                    ion_dictionary_size_t dictionary_size)

{
  ion_dictionary_id_t local_38;
  ion_err_t local_31;
  ion_dictionary_id_t id;
  ion_value_size_t iStack_2c;
  ion_err_t err;
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_t *dictionary_local;
  ion_dictionary_handler_t *handler_local;
  
  id = dictionary_size;
  iStack_2c = value_size;
  dictionary_size_local = key_size;
  value_size_local = key_type;
  _key_size_local = dictionary;
  dictionary_local = (ion_dictionary_t *)handler;
  local_31 = ion_master_table_get_next_id(&local_38);
  handler_local._7_1_ = local_31;
  if ((local_31 == '\0') &&
     (local_31 = dictionary_create((ion_dictionary_handler_t *)dictionary_local,_key_size_local,
                                   local_38,value_size_local,dictionary_size_local,iStack_2c,id),
     handler_local._7_1_ = local_31, local_31 == '\0')) {
    handler_local._7_1_ = ion_add_to_master_table(_key_size_local,id);
  }
  return handler_local._7_1_;
}

Assistant:

ion_err_t
ion_master_table_create_dictionary(
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size
) {
	ion_err_t			err;
	ion_dictionary_id_t id;

	err = ion_master_table_get_next_id(&id);

	if (err_ok != err) {
		return err;
	}

	err = dictionary_create(handler, dictionary, id, key_type, key_size, value_size, dictionary_size);

	if (err_ok != err) {
		return err;
	}

	err = ion_add_to_master_table(dictionary, dictionary_size);

	return err;
}